

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.hpp
# Opt level: O1

Socket<512UL> __thiscall
ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>::
openUnicastSocket<512ul>
          (Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog> *this,
          address_v4 *addr)

{
  socklen_t __len;
  io_context *__args;
  uint *in_RDX;
  sockaddr *__addr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Socket<512UL> SVar1;
  network_interface<0,_32,_41,_17> local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined8 uStack_34;
  
  __args = *(io_context **)addr;
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ableton::platforms::asio::Socket<512ul>::Impl,std::allocator<ableton::platforms::asio::Socket<512ul>::Impl>,asio::io_context&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),(Impl **)this,
             (allocator<ableton::platforms::asio::Socket<512UL>::Impl> *)&local_48,__args);
  __len = (socklen_t)__args;
  local_48.ipv6_value_._0_1_ = (char)*in_RDX == '\x7f';
  local_48.ipv4_value_.s_addr = (uint)local_48.ipv6_value_._0_1_;
  local_48.ipv6_value_._1_3_ = 0;
  ::asio::basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
  set_option<asio::ip::detail::socket_option::multicast_enable_loopback<0,34,41,19>>
            (*(basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>> **)this,
             (multicast_enable_loopback<0,_34,_41,_19> *)&local_48);
  local_48.ipv6_value_ = 0;
  local_48.ipv4_value_.s_addr = *in_RDX;
  ::asio::basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
  set_option<asio::ip::detail::socket_option::network_interface<0,32,41,17>>
            (*(basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>> **)this,
             &local_48);
  uStack_40 = 0;
  uStack_3c = 0;
  uStack_38 = 0;
  uStack_34 = 0;
  local_48.ipv6_value_ = *in_RDX;
  local_48.ipv4_value_.s_addr = 2;
  ::asio::basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>::bind
            (*(basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> **)this,
             (int)&local_48,__addr,__len);
  SVar1.mpImpl.
  super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  SVar1.mpImpl.
  super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Socket<512UL>)
         SVar1.mpImpl.
         super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Socket<BufferSize> openUnicastSocket(const ::asio::ip::address_v4& addr)
  {
    auto socket = Socket<BufferSize>{*mpService};
    socket.mpImpl->mSocket.set_option(
      ::asio::ip::multicast::enable_loopback(addr.is_loopback()));
    socket.mpImpl->mSocket.set_option(::asio::ip::multicast::outbound_interface(addr));
    socket.mpImpl->mSocket.bind(::asio::ip::udp::endpoint{addr, 0});
    return socket;
  }